

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_contracthashutil.cpp
# Opt level: O1

void __thiscall
ContractHashUtil_GetContractScriptOpTrue_Test::~ContractHashUtil_GetContractScriptOpTrue_Test
          (ContractHashUtil_GetContractScriptOpTrue_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ContractHashUtil, GetContractScriptOpTrue) {
  Script claim_script("0014fd1cd5452a43ca210ba7153d64227dc32acf6dbb");
  Script fedpeg_script("51");  // OP_TRUE
  Script script;
  EXPECT_NO_THROW(
      (script = ContractHashUtil::GetContractScript(claim_script,
          fedpeg_script)));
  EXPECT_STREQ(script.GetHex().c_str(), "51");
}